

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# personal_settings.cpp
# Opt level: O0

void __thiscall PersonalSettings::parse_json(PersonalSettings *this,Json *json)

{
  pointer *this_00;
  mapped_type mVar1;
  initializer_list<unsigned_char> __l;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar2;
  bool bVar3;
  const_reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  reference puVar11;
  LandstalkerException *pLVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  type_conflict *local_270;
  type_conflict *item_id_1;
  type *item_name;
  _Self local_258;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *__range3;
  uchar local_233;
  mapped_type local_232 [2];
  undefined1 local_230 [5];
  uint8_t first_missing_item_id;
  uint8_t item_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  byte local_1ea;
  allocator<char> local_1e9;
  undefined1 local_1e8 [6];
  uint8_t i;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  undefined1 local_198 [8];
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> mandatory_items;
  key_type local_160;
  allocator<char> local_139;
  key_type local_138;
  Color local_115;
  allocator<char> local_111;
  key_type local_110;
  Color local_ed;
  allocator<char> local_e9;
  key_type local_e8;
  Color local_c5;
  allocator<char> local_c1;
  key_type local_c0;
  Color local_9d;
  allocator<char> local_99;
  key_type local_98;
  allocator<char> local_71;
  key_type local_70;
  Color local_50;
  allocator<char> local_39;
  key_type local_38;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_18;
  Json *json_local;
  PersonalSettings *this_local;
  
  local_18 = json;
  json_local = (Json *)this;
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[14],_0>(json,(char (*) [14])"inGameTracker");
  pbVar2 = local_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"inGameTracker",&local_39);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar2,&local_38);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_bool<bool,_0>(pvVar4);
    this->_add_ingame_item_tracker = bVar3;
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[9],_0>(local_18,(char (*) [9])"hudColor");
  pbVar2 = local_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"hudColor",&local_71);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar2,&local_70);
    local_50 = Color::from_json(pvVar4);
    this->_hud_color = local_50;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[11],_0>(local_18,(char (*) [11])"nigelColor");
  pbVar2 = local_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"nigelColor",&local_99);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar2,&local_98);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::is_array(pvVar4);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    pbVar2 = local_18;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"nigelColor",&local_c1)
      ;
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pbVar2,&local_c0);
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](pvVar4,0);
      local_9d = Color::from_json(pvVar4);
      (this->_nigel_colors).first = local_9d;
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      pbVar2 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"nigelColor",&local_e9)
      ;
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pbVar2,&local_e8);
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator[](pvVar4,1);
      local_c5 = Color::from_json(pvVar4);
      (this->_nigel_colors).second = local_c5;
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"nigelColor",&local_111);
      pvVar4 = nlohmann::
               basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(pbVar2,&local_110);
      local_ed = Color::from_json(pvVar4);
      (this->_nigel_colors).first = local_ed;
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
      local_115 = Color::subtract(&(this->_nigel_colors).first,'@');
      (this->_nigel_colors).second = local_115;
    }
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[12],_0>(local_18,(char (*) [12])"removeMusic");
  pbVar2 = local_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"removeMusic",&local_139);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar2,&local_138);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_bool<bool,_0>(pvVar4);
    this->_remove_music = bVar3;
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[19],_0>(local_18,(char (*) [19])"swapOverworldMusic");
  pbVar2 = local_18;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"swapOverworldMusic",
               (allocator<char> *)
               ((long)&mandatory_items._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar2,&local_160);
    bVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator_bool<bool,_0>(pvVar4);
    this->_swap_overworld_music = bVar3;
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&mandatory_items._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  bVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[15],_0>(local_18,(char (*) [15])"inventoryOrder");
  if (bVar3) {
    mandatory_items._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0xff;
    std::array<unsigned_char,_40UL>::fill
              (&this->_inventory_order,
               (value_type_conflict *)
               ((long)&mandatory_items._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0x32;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0x31;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x1b;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0x2f;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0x2b;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x20;
    this_00 = &items.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)this_00);
    __l._M_len = 6;
    __l._M_array = (iterator)
                   ((long)&items.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set
              ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               local_198,__l,
               (less<unsigned_char> *)
               ((long)&items.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
               (allocator_type *)this_00);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)
               &items.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pbVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,"inventoryOrder",&local_1e9);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(pbVar2,(key_type *)local_1e8);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c8,pvVar4);
    std::__cxx11::string::~string((string *)local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    local_1ea = 0;
    while( true ) {
      uVar5 = (ulong)local_1ea;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1c8);
      bVar3 = false;
      if (uVar5 < sVar6) {
        uVar5 = (ulong)local_1ea;
        sVar6 = std::array<unsigned_char,_40UL>::size(&this->_inventory_order);
        bVar3 = uVar5 < sVar6;
      }
      if (!bVar3) break;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1c8,(ulong)local_1ea);
      sVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
              ::count(&this->_item_names,pvVar7);
      if (sVar8 == 0) {
        local_232[1] = 1;
        pLVar12 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1c8,(ulong)local_1ea);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,"Unknown item name \'",pvVar7);
        std::operator+(&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,"\' in inventory order section of personal settings file.");
        LandstalkerException::LandstalkerException(pLVar12,&local_210);
        local_232[1] = 0;
        __cxa_throw(pLVar12,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_1c8,(ulong)local_1ea);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               ::operator[](&this->_item_names,pvVar7);
      mVar1 = *pmVar9;
      local_232[0] = mVar1;
      pvVar10 = std::array<unsigned_char,_40UL>::operator[]
                          (&this->_inventory_order,(ulong)local_1ea);
      *pvVar10 = mVar1;
      bVar3 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
              contains((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                        *)local_198,local_232);
      if (bVar3) {
        std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::erase
                  ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
                   local_198,local_232);
      }
      local_1ea = local_1ea + 1;
    }
    bVar3 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::empty
                      ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                        *)local_198);
    if (!bVar3) {
      __range3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                  *)std::
                    set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
                    begin((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                           *)local_198);
      puVar11 = std::_Rb_tree_const_iterator<unsigned_char>::operator*
                          ((_Rb_tree_const_iterator<unsigned_char> *)&__range3);
      local_233 = *puVar11;
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               ::begin(&this->_item_names);
      local_258._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::end(&this->_item_names);
      while (bVar3 = std::operator==(&__end3,&local_258), ((bVar3 ^ 0xffU) & 1) != 0) {
        item_name = &std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>
                     ::operator*(&__end3)->first;
        item_id_1 = (type_conflict *)
                    std::get<0ul,std::__cxx11::string_const,unsigned_char>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
                                *)item_name);
        local_270 = std::get<1ul,std::__cxx11::string_const,unsigned_char>
                              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
                                *)item_name);
        if (*local_270 == local_233) {
          pLVar12 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::operator+(&local_2b0,"Cannot omit ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         item_id_1);
          std::operator+(&local_290,&local_2b0,
                         " from inventory order since it could make seeds uncompletable");
          LandstalkerException::LandstalkerException(pLVar12,&local_290);
          __cxa_throw(pLVar12,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>
        ::operator++(&__end3);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
    std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
              ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
               local_198);
  }
  return;
}

Assistant:

void PersonalSettings::parse_json(const Json& json)
{
    if(json.contains("inGameTracker"))
        _add_ingame_item_tracker = json.at("inGameTracker");

    if(json.contains("hudColor"))
        _hud_color = Color::from_json(json.at("hudColor"));

    if(json.contains("nigelColor"))
    {
        if(json.at("nigelColor").is_array())
        {
            _nigel_colors.first = Color::from_json(json.at("nigelColor")[0]);
            _nigel_colors.second = Color::from_json(json.at("nigelColor")[1]);
        }
        else
        {
            _nigel_colors.first = Color::from_json(json.at("nigelColor"));
            _nigel_colors.second = _nigel_colors.first.subtract(0x40);
        }
    }

    if(json.contains("removeMusic"))
        _remove_music = json.at("removeMusic");

    if(json.contains("swapOverworldMusic"))
        _swap_overworld_music = json.at("swapOverworldMusic");

    if(json.contains("inventoryOrder"))
    {
        _inventory_order.fill(0xFF);

        std::set<uint8_t> mandatory_items = {
            ITEM_KEY, ITEM_IDOL_STONE, ITEM_GARLIC, ITEM_LOGS, ITEM_GOLA_EYE, ITEM_EINSTEIN_WHISTLE
        };

        std::vector<std::string> items = json.at("inventoryOrder");
        for(uint8_t i=0 ; i < items.size() && i < _inventory_order.size() ; ++i)
        {
            if(!_item_names.count(items[i]))
                throw LandstalkerException("Unknown item name '" + items[i] + "' in inventory order section of personal settings file.");
            uint8_t item_id = _item_names[items[i]];
            _inventory_order[i] = item_id;

            if(mandatory_items.contains(item_id))
                mandatory_items.erase(item_id);
        }

        if(!mandatory_items.empty())
        {
            uint8_t first_missing_item_id = *mandatory_items.begin();
            for(auto& [item_name, item_id] : _item_names)
                if(item_id == first_missing_item_id)
                    throw LandstalkerException("Cannot omit " + item_name + " from inventory order since it could make seeds uncompletable");
        }
    }
}